

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentSizeTextureCase::testDepthAttachment
          (UnspecifiedAttachmentSizeTextureCase *this)

{
  GLuint local_14;
  UnspecifiedAttachmentSizeTextureCase *pUStack_10;
  GLuint textureID;
  UnspecifiedAttachmentSizeTextureCase *this_local;
  
  local_14 = 0;
  pUStack_10 = this;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,1,
             &local_14);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0xde1,
             local_14);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
             0x8d00,0xde1,local_14,0);
  ApiCase::expectError((ApiCase *)this,0);
  checkAttachmentComponentSizeExactly
            ((this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase
             .super_TestNode.m_testCtx,
             &(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
             0x8d00,0,0,0,0,0,0);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,0x8d40,
             0x8d00,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_UnspecifiedAttachmentSizeCase).super_ApiCase.super_CallLogWrapper,1,
             &local_14);
  return;
}

Assistant:

void testDepthAttachment (void)
	{
		GLuint textureID = 0;
		glGenTextures(1, &textureID);
		glBindTexture(GL_TEXTURE_2D, textureID);
		expectError(GL_NO_ERROR);

		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);
		expectError(GL_NO_ERROR);

		checkAttachmentComponentSizeExactly	(m_testCtx, *this, GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, 0, 0, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, 0, 0);
		glDeleteTextures(1, &textureID);
	}